

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O2

void __thiscall
TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,ClassDeclaration *class_declaration)

{
  Symbol SStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)&class_declaration->class_name_);
  Symbol::Symbol(&SStack_58,&local_38);
  TraverseToChildByClassSymbol(this,&SStack_58);
  std::__cxx11::string::~string((string *)&SStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  TemplateVisitor<int>::Accept
            ((TemplateVisitor<int> *)this,(Node *)class_declaration->declarations_);
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(ClassDeclaration* class_declaration) {
  TraverseToChildByClassSymbol(Symbol(class_declaration->class_name_));

  Accept(class_declaration->declarations_);

  current_layer_ = current_layer_->parent_;
}